

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O2

char * reverse(char *s)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar3 = strlen(s);
  uVar2 = (uint)sVar3;
  uVar5 = 0;
  while( true ) {
    uVar2 = uVar2 - 1;
    uVar4 = (ulong)uVar2;
    if (uVar4 <= uVar5) break;
    cVar1 = s[uVar5];
    s[uVar5] = s[uVar4];
    s[uVar4] = cVar1;
    uVar5 = uVar5 + 1;
  }
  return s;
}

Assistant:

char *reverse(char *s) {
    unsigned long len = strlen(s);
    char chr;
    for (uint i = len - 1, j = 0; j < i; --i, j++) {
        chr = s[j];
        s[j] = s[i];
        s[i] = chr;
    }
    return s;
}